

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_statement.cpp
# Opt level: O2

string * __thiscall
duckdb::ExportStatement::ToString_abi_cxx11_(string *__return_storage_ptr__,ExportStatement *this)

{
  pointer pCVar1;
  pointer pCVar2;
  pointer pCVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40 [32];
  
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,anon_var_dwarf_3b2a81b + 9,(allocator *)&local_a0);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->database)._M_string_length != 0) {
    ::std::operator+(&local_80," ",&this->database);
    ::std::operator+(&local_a0,&local_80," TO");
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_80);
  }
  this_00 = &this->info;
  pCVar1 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     (this_00);
  pCVar2 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     (this_00);
  pCVar3 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     (this_00);
  ::std::__cxx11::string::string(local_40," \'%s\'",(allocator *)&local_80);
  ::std::__cxx11::string::string((string *)&local_60,(string *)&pCVar1->file_path);
  StringUtil::Format<std::__cxx11::string>(&local_a0,(StringUtil *)local_40,&local_60,in_RCX);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string(local_40);
  CopyInfo::CopyOptionsToString(&local_a0,&pCVar3->format,&pCVar2->options);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string ExportStatement::ToString() const {
	string result = "";
	result += "EXPORT DATABASE";
	if (!database.empty()) {
		result += " " + database + " TO";
	}
	auto &path = info->file_path;
	D_ASSERT(info->is_from == false);
	auto &options = info->options;
	auto &format = info->format;
	result += StringUtil::Format(" '%s'", path);
	result += CopyInfo::CopyOptionsToString(format, options);
	result += ";";
	return result;
}